

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

int Gia_ManCheckSupp_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  if ((*(ulong *)pObj >> 0x1e & 1) == 0) {
    iVar1 = Gia_ObjIsCi(pObj);
    if (iVar1 == 0) {
      pGVar2 = Gia_ObjFanin0(pObj);
      iVar1 = Gia_ManCheckSupp_rec(p,pGVar2);
      if (iVar1 == 0) {
        pGVar2 = Gia_ObjFanin1(pObj);
        p_local._4_4_ = Gia_ManCheckSupp_rec(p,pGVar2);
      }
      else {
        p_local._4_4_ = 1;
      }
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  else {
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManCheckSupp_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( pObj->fMark0 )
        return 1;
    if ( Gia_ObjIsCi(pObj) )
        return 0;
    if ( Gia_ManCheckSupp_rec( p, Gia_ObjFanin0(pObj) ) )
        return 1;
    return Gia_ManCheckSupp_rec( p, Gia_ObjFanin1(pObj) );
}